

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall
re2::RE2::ReverseProg::anon_class_8_1_8991fb9c::operator()(anon_class_8_1_8991fb9c *this)

{
  RE2 *str;
  Regexp *this_00;
  bool bVar1;
  int64_t iVar2;
  Prog *pPVar3;
  ostream *poVar4;
  string *this_01;
  double __x;
  allocator local_1d1;
  StringPiece local_1d0;
  re2 local_1c0 [48];
  LogMessage local_190;
  anon_class_8_1_8991fb9c *local_10;
  anon_class_8_1_8991fb9c *this_local;
  
  str = this->this;
  this_00 = str->suffix_regexp_;
  local_10 = this;
  iVar2 = Options::max_mem(&str->options_);
  pPVar3 = re2::Regexp::CompileToReverseProg(this_00,iVar2 / 3);
  str->rprog_ = pPVar3;
  if (str->rprog_ == (Prog *)0x0) {
    bVar1 = Options::log_errors(&str->options_);
    if (bVar1) {
      LogMessage::LogMessage
                (&local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0xe6,
                 2);
      poVar4 = LogMessage::stream(&local_190);
      poVar4 = std::operator<<(poVar4,"Error reverse compiling \'");
      StringPiece::StringPiece(&local_1d0,&str->pattern_);
      trunc_abi_cxx11_(local_1c0,__x);
      poVar4 = std::operator<<(poVar4,(string *)local_1c0);
      std::operator<<(poVar4,"\'");
      std::__cxx11::string::~string((string *)local_1c0);
      LogMessage::~LogMessage(&local_190);
    }
    this_01 = (string *)operator_new(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_01,"pattern too large - reverse compile failed",&local_1d1);
    str->error_ = (string *)this_01;
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    str->error_code_ = ErrorPatternTooLarge;
  }
  return;
}

Assistant:

re2::Prog* RE2::ReverseProg() const {
  std::call_once(rprog_once_, [this]() {
    rprog_ = suffix_regexp_->CompileToReverseProg(options_.max_mem()/3);
    if (rprog_ == NULL) {
      if (options_.log_errors())
        LOG(ERROR) << "Error reverse compiling '" << trunc(pattern_) << "'";
      error_ = new string("pattern too large - reverse compile failed");
      error_code_ = RE2::ErrorPatternTooLarge;
    }
  });
  return rprog_;
}